

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O3

int zap_hit_check(int ac,int type)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar2 = mt_random();
  if (type == 0) {
    iVar3 = 0;
  }
  else {
    bVar1 = acurr(3);
    iVar3 = spell_skilltype(type);
    uVar6 = (ulong)(byte)u.weapon_skills[iVar3].skill;
    iVar3 = 0;
    if (uVar6 < 5) {
      iVar3 = *(int *)(&DAT_002dbc44 + uVar6 * 4);
    }
    if ((char)bVar1 < '\x04') {
      iVar3 = iVar3 + -3;
    }
    else if (bVar1 < 6) {
      iVar3 = iVar3 + -2;
    }
    else if (bVar1 < 8) {
      iVar3 = iVar3 + -1;
    }
    else if (0xd < bVar1) {
      iVar3 = iVar3 + (uint)(byte)(bVar1 - 0xe);
    }
  }
  if (uVar2 % 0x14 == 0) {
    uVar2 = mt_random();
    iVar5 = uVar2 % 10 + 1;
    bVar7 = SBORROW4(iVar5,iVar3 + ac);
    iVar5 = iVar5 - (iVar3 + ac);
  }
  else {
    if (ac < 0) {
      uVar4 = mt_random();
      ac = ~(uVar4 % (uint)-ac);
    }
    iVar5 = 3 - uVar2 % 0x14;
    bVar7 = SBORROW4(iVar5,ac + iVar3);
    iVar5 = iVar5 - (ac + iVar3);
  }
  return (int)(bVar7 != iVar5 < 0);
}

Assistant:

static int zap_hit_check(int ac, 
		   int type)	/* either hero cast spell type or 0 */
{
    int chance = rn2(20);
    int spell_bonus = type ? spell_hit_bonus(type) : 0;

    /* small chance for naked target to avoid being hit */
    if (!chance) return rnd(10) < ac+spell_bonus;

    /* very high armor protection does not achieve invulnerability */
    ac = AC_VALUE(ac);

    return (3 - chance) < ac+spell_bonus;
}